

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

void __thiscall tokenizer::read_invalid_token(tokenizer *this)

{
  char *pcVar1;
  
  pcVar1 = this->line_char;
  this->last_line_number = this->line_number;
  this->last_position_number = this->position_number;
  do {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&this->current_word,*pcVar1);
    pcVar1 = this->line_char + 1;
    this->line_char = pcVar1;
    this->position_number = this->position_number + 1;
  } while( true );
}

Assistant:

void tokenizer::read_invalid_token() {
    last_position_number = position_number;
    last_line_number = line_number;

    while(*line_char != '\0' || *line_char != ' ' || *line_char != '\t') {
        current_word += *line_char;
        this->advance_to_next_character();
    }

    this->add_token_to_stream(Token_Type::invalid);
    //position_number += current_word.length();
    current_word = "";
}